

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

string_t * __thiscall
nlohmann::
basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
::type_name(string_t *__return_storage_ptr__,
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator>
           *this)

{
  byte bVar1;
  long lVar2;
  char *pcVar3;
  char *pcVar4;
  
  bVar1 = *(byte *)&this->m_type & 0xf;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (bVar1 < 9) {
    lVar2 = (ulong)bVar1 * 4;
    pcVar4 = &DAT_0010cd7c + *(int *)(&DAT_0010cd7c + lVar2);
    pcVar3 = &DAT_0010cda0 + *(int *)(&DAT_0010cda0 + lVar2);
  }
  else {
    pcVar3 = "";
    pcVar4 = "number";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar4,pcVar3);
  return __return_storage_ptr__;
}

Assistant:

string_t type_name() const noexcept
        {
            switch (m_type)
            {
                case value_t::null:
                    return "null";
                case value_t::object:
                    return "object";
                case value_t::array:
                    return "array";
                case value_t::string:
                    return "string";
                case value_t::boolean:
                    return "boolean";
                case value_t::discarded:
                    return "discarded";
                default:
                    return "number";
            }
        }